

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O0

void yyml::nn::ReLU<double>(Variable<double> *v,Variable<double> *result)

{
  initializer_list<yyml::nn::Autograd<double>_*> __l;
  size_t sVar1;
  double local_60;
  ulong local_50;
  size_t i;
  iterator local_40;
  undefined8 local_38;
  type local_30;
  Variable<double> *local_18;
  Variable<double> *result_local;
  Variable<double> *v_local;
  
  local_18 = result;
  result_local = v;
  std::
  bind<void(&)(yyml::nn::Variable<double>*,yyml::nn::Variable<double>*),yyml::nn::Variable<double>*&,yyml::nn::Variable<double>*&>
            (&local_30,ReLUBackward<double>,&result_local,&local_18);
  std::function<void()>::operator=((function<void()> *)&(local_18->autograd_).backward_fn,&local_30)
  ;
  i = (size_t)&result_local->autograd_;
  local_40 = (iterator)&i;
  local_38 = 1;
  __l._M_len = 1;
  __l._M_array = local_40;
  std::vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::
  operator=(&(local_18->autograd_).next,__l);
  local_50 = 0;
  while( true ) {
    sVar1 = Tensor<double>::total(&result_local->values_);
    if (sVar1 <= local_50) break;
    if ((result_local->values_).data_[local_50] < 0.0) {
      local_60 = 0.0;
    }
    else {
      local_60 = (result_local->values_).data_[local_50];
    }
    (local_18->values_).data_[local_50] = local_60;
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

void ReLU(Variable<Type>* v, Variable<Type>* result) {
  result->autograd_.backward_fn = std::bind(ReLUBackward<Type>, v, result);
  result->autograd_.next = {&v->autograd_};
  for (size_t i = 0; i < v->values_.total(); i++) {
    result->values_.data_[i] =
        v->values_.data_[i] >= 0 ? v->values_.data_[i] : 0;
  }
}